

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O1

void FTransform2_SSE2(uint8_t *src,uint8_t *ref,int16_t *out)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  unkuint9 Var64;
  undefined1 auVar65 [11];
  undefined1 auVar66 [13];
  undefined1 auVar67 [15];
  unkuint9 Var68;
  undefined1 auVar69 [11];
  undefined1 auVar70 [15];
  unkuint9 Var71;
  undefined1 auVar72 [11];
  undefined1 auVar73 [13];
  undefined1 auVar74 [15];
  unkuint9 Var75;
  undefined1 auVar76 [11];
  undefined1 auVar77 [15];
  unkuint9 Var78;
  undefined1 auVar79 [11];
  undefined1 auVar80 [15];
  unkuint9 Var81;
  undefined1 auVar82 [11];
  undefined1 auVar83 [15];
  undefined1 auVar84 [11];
  undefined1 auVar85 [15];
  undefined1 auVar86 [11];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [12];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar115;
  short sVar116;
  short sVar117;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  short sVar118;
  undefined1 auVar119 [12];
  short sVar122;
  short sVar123;
  short sVar124;
  undefined1 auVar120 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  short sVar138;
  short sVar139;
  short sVar140;
  short sVar141;
  short sVar142;
  undefined1 auVar137 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar149 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  short sVar156;
  short sVar161;
  short sVar162;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  short sVar163;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar164 [16];
  undefined1 auVar121 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  short sVar150;
  
  auVar114 = _DAT_001b67e0;
  auVar106 = _DAT_001b67d0;
  uVar1 = *(ulong *)src;
  uVar2 = *(ulong *)(src + 0x20);
  uVar3 = *(ulong *)(src + 0x40);
  uVar4 = *(ulong *)(src + 0x60);
  auVar16._8_6_ = 0;
  auVar16._0_8_ = uVar1;
  auVar16[0xe] = (char)(uVar1 >> 0x38);
  auVar24._8_4_ = 0;
  auVar24._0_8_ = uVar1;
  auVar24[0xc] = (char)(uVar1 >> 0x30);
  auVar24._13_2_ = auVar16._13_2_;
  auVar32._8_4_ = 0;
  auVar32._0_8_ = uVar1;
  auVar32._12_3_ = auVar24._12_3_;
  auVar40._8_2_ = 0;
  auVar40._0_8_ = uVar1;
  auVar40[10] = (char)(uVar1 >> 0x28);
  auVar40._11_4_ = auVar32._11_4_;
  auVar48._8_2_ = 0;
  auVar48._0_8_ = uVar1;
  auVar48._10_5_ = auVar40._10_5_;
  auVar56[8] = (char)(uVar1 >> 0x20);
  auVar56._0_8_ = uVar1;
  auVar56._9_6_ = auVar48._9_6_;
  auVar63._7_8_ = 0;
  auVar63._0_7_ = auVar56._8_7_;
  Var64 = CONCAT81(SUB158(auVar63 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar87._9_6_ = 0;
  auVar87._0_9_ = Var64;
  auVar65._1_10_ = SUB1510(auVar87 << 0x30,5);
  auVar65[0] = (char)(uVar1 >> 0x10);
  auVar88._11_4_ = 0;
  auVar88._0_11_ = auVar65;
  auVar66._1_12_ = SUB1512(auVar88 << 0x20,3);
  auVar66[0] = (char)(uVar1 >> 8);
  auVar9._8_6_ = 0;
  auVar9._0_8_ = uVar2;
  auVar9[0xe] = (char)(uVar2 >> 0x38);
  auVar17._8_4_ = 0;
  auVar17._0_8_ = uVar2;
  auVar17[0xc] = (char)(uVar2 >> 0x30);
  auVar17._13_2_ = auVar9._13_2_;
  auVar25._8_4_ = 0;
  auVar25._0_8_ = uVar2;
  auVar25._12_3_ = auVar17._12_3_;
  auVar33._8_2_ = 0;
  auVar33._0_8_ = uVar2;
  auVar33[10] = (char)(uVar2 >> 0x28);
  auVar33._11_4_ = auVar25._11_4_;
  auVar41._8_2_ = 0;
  auVar41._0_8_ = uVar2;
  auVar41._10_5_ = auVar33._10_5_;
  auVar49[8] = (char)(uVar2 >> 0x20);
  auVar49._0_8_ = uVar2;
  auVar49._9_6_ = auVar41._9_6_;
  auVar67._7_8_ = 0;
  auVar67._0_7_ = auVar49._8_7_;
  Var68 = CONCAT81(SUB158(auVar67 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar89._9_6_ = 0;
  auVar89._0_9_ = Var68;
  auVar69._1_10_ = SUB1510(auVar89 << 0x30,5);
  auVar69[0] = (char)(uVar2 >> 0x10);
  auVar90._11_4_ = 0;
  auVar90._0_11_ = auVar69;
  auVar57[2] = (char)(uVar2 >> 8);
  auVar57._0_2_ = (ushort)uVar2;
  auVar57._3_12_ = SUB1512(auVar90 << 0x20,3);
  auVar10._8_6_ = 0;
  auVar10._0_8_ = uVar3;
  auVar10[0xe] = (char)(uVar3 >> 0x38);
  auVar18._8_4_ = 0;
  auVar18._0_8_ = uVar3;
  auVar18[0xc] = (char)(uVar3 >> 0x30);
  auVar18._13_2_ = auVar10._13_2_;
  auVar26._8_4_ = 0;
  auVar26._0_8_ = uVar3;
  auVar26._12_3_ = auVar18._12_3_;
  auVar34._8_2_ = 0;
  auVar34._0_8_ = uVar3;
  auVar34[10] = (char)(uVar3 >> 0x28);
  auVar34._11_4_ = auVar26._11_4_;
  auVar42._8_2_ = 0;
  auVar42._0_8_ = uVar3;
  auVar42._10_5_ = auVar34._10_5_;
  auVar50[8] = (char)(uVar3 >> 0x20);
  auVar50._0_8_ = uVar3;
  auVar50._9_6_ = auVar42._9_6_;
  auVar70._7_8_ = 0;
  auVar70._0_7_ = auVar50._8_7_;
  Var71 = CONCAT81(SUB158(auVar70 << 0x40,7),(char)(uVar3 >> 0x18));
  auVar91._9_6_ = 0;
  auVar91._0_9_ = Var71;
  auVar72._1_10_ = SUB1510(auVar91 << 0x30,5);
  auVar72[0] = (char)(uVar3 >> 0x10);
  auVar92._11_4_ = 0;
  auVar92._0_11_ = auVar72;
  auVar73._1_12_ = SUB1512(auVar92 << 0x20,3);
  auVar73[0] = (char)(uVar3 >> 8);
  auVar11._8_6_ = 0;
  auVar11._0_8_ = uVar4;
  auVar11[0xe] = (char)(uVar4 >> 0x38);
  auVar19._8_4_ = 0;
  auVar19._0_8_ = uVar4;
  auVar19[0xc] = (char)(uVar4 >> 0x30);
  auVar19._13_2_ = auVar11._13_2_;
  auVar27._8_4_ = 0;
  auVar27._0_8_ = uVar4;
  auVar27._12_3_ = auVar19._12_3_;
  auVar35._8_2_ = 0;
  auVar35._0_8_ = uVar4;
  auVar35[10] = (char)(uVar4 >> 0x28);
  auVar35._11_4_ = auVar27._11_4_;
  auVar43._8_2_ = 0;
  auVar43._0_8_ = uVar4;
  auVar43._10_5_ = auVar35._10_5_;
  auVar51[8] = (char)(uVar4 >> 0x20);
  auVar51._0_8_ = uVar4;
  auVar51._9_6_ = auVar43._9_6_;
  auVar74._7_8_ = 0;
  auVar74._0_7_ = auVar51._8_7_;
  Var75 = CONCAT81(SUB158(auVar74 << 0x40,7),(char)(uVar4 >> 0x18));
  auVar93._9_6_ = 0;
  auVar93._0_9_ = Var75;
  auVar76._1_10_ = SUB1510(auVar93 << 0x30,5);
  auVar76[0] = (char)(uVar4 >> 0x10);
  auVar94._11_4_ = 0;
  auVar94._0_11_ = auVar76;
  auVar58[2] = (char)(uVar4 >> 8);
  auVar58._0_2_ = (ushort)uVar4;
  auVar58._3_12_ = SUB1512(auVar94 << 0x20,3);
  uVar5 = *(ulong *)ref;
  uVar6 = *(ulong *)(ref + 0x20);
  uVar7 = *(ulong *)(ref + 0x40);
  uVar8 = *(ulong *)(ref + 0x60);
  auVar12._8_6_ = 0;
  auVar12._0_8_ = uVar5;
  auVar12[0xe] = (char)(uVar5 >> 0x38);
  auVar20._8_4_ = 0;
  auVar20._0_8_ = uVar5;
  auVar20[0xc] = (char)(uVar5 >> 0x30);
  auVar20._13_2_ = auVar12._13_2_;
  auVar28._8_4_ = 0;
  auVar28._0_8_ = uVar5;
  auVar28._12_3_ = auVar20._12_3_;
  auVar36._8_2_ = 0;
  auVar36._0_8_ = uVar5;
  auVar36[10] = (char)(uVar5 >> 0x28);
  auVar36._11_4_ = auVar28._11_4_;
  auVar44._8_2_ = 0;
  auVar44._0_8_ = uVar5;
  auVar44._10_5_ = auVar36._10_5_;
  auVar52[8] = (char)(uVar5 >> 0x20);
  auVar52._0_8_ = uVar5;
  auVar52._9_6_ = auVar44._9_6_;
  auVar77._7_8_ = 0;
  auVar77._0_7_ = auVar52._8_7_;
  Var78 = CONCAT81(SUB158(auVar77 << 0x40,7),(char)(uVar5 >> 0x18));
  auVar95._9_6_ = 0;
  auVar95._0_9_ = Var78;
  auVar79._1_10_ = SUB1510(auVar95 << 0x30,5);
  auVar79[0] = (char)(uVar5 >> 0x10);
  auVar96._11_4_ = 0;
  auVar96._0_11_ = auVar79;
  auVar59[2] = (char)(uVar5 >> 8);
  auVar59._0_2_ = (ushort)uVar5;
  auVar59._3_12_ = SUB1512(auVar96 << 0x20,3);
  sVar107 = (ushort)(byte)uVar1 - ((ushort)uVar5 & 0xff);
  sVar108 = auVar66._0_2_ - auVar59._2_2_;
  sVar109 = auVar56._8_2_ - auVar52._8_2_;
  sVar110 = auVar40._10_2_ - auVar36._10_2_;
  auVar13._8_6_ = 0;
  auVar13._0_8_ = uVar6;
  auVar13[0xe] = (char)(uVar6 >> 0x38);
  auVar21._8_4_ = 0;
  auVar21._0_8_ = uVar6;
  auVar21[0xc] = (char)(uVar6 >> 0x30);
  auVar21._13_2_ = auVar13._13_2_;
  auVar29._8_4_ = 0;
  auVar29._0_8_ = uVar6;
  auVar29._12_3_ = auVar21._12_3_;
  auVar37._8_2_ = 0;
  auVar37._0_8_ = uVar6;
  auVar37[10] = (char)(uVar6 >> 0x28);
  auVar37._11_4_ = auVar29._11_4_;
  auVar45._8_2_ = 0;
  auVar45._0_8_ = uVar6;
  auVar45._10_5_ = auVar37._10_5_;
  auVar53[8] = (char)(uVar6 >> 0x20);
  auVar53._0_8_ = uVar6;
  auVar53._9_6_ = auVar45._9_6_;
  auVar80._7_8_ = 0;
  auVar80._0_7_ = auVar53._8_7_;
  Var81 = CONCAT81(SUB158(auVar80 << 0x40,7),(char)(uVar6 >> 0x18));
  auVar97._9_6_ = 0;
  auVar97._0_9_ = Var81;
  auVar82._1_10_ = SUB1510(auVar97 << 0x30,5);
  auVar82[0] = (char)(uVar6 >> 0x10);
  auVar98._11_4_ = 0;
  auVar98._0_11_ = auVar82;
  auVar60[2] = (char)(uVar6 >> 8);
  auVar60._0_2_ = (ushort)uVar6;
  auVar60._3_12_ = SUB1512(auVar98 << 0x20,3);
  auVar105._0_2_ = ((ushort)uVar2 & 0xff) - ((ushort)uVar6 & 0xff);
  auVar105._2_2_ = auVar57._2_2_ - auVar60._2_2_;
  auVar105._4_2_ = auVar69._0_2_ - auVar82._0_2_;
  auVar105._6_2_ = (short)Var68 - (short)Var81;
  auVar105._8_2_ = auVar49._8_2_ - auVar53._8_2_;
  auVar105._10_2_ = auVar33._10_2_ - auVar37._10_2_;
  auVar105._12_2_ = auVar17._12_2_ - auVar21._12_2_;
  auVar105._14_2_ = (auVar9._13_2_ >> 8) - (auVar13._13_2_ >> 8);
  auVar14._8_6_ = 0;
  auVar14._0_8_ = uVar7;
  auVar14[0xe] = (char)(uVar7 >> 0x38);
  auVar22._8_4_ = 0;
  auVar22._0_8_ = uVar7;
  auVar22[0xc] = (char)(uVar7 >> 0x30);
  auVar22._13_2_ = auVar14._13_2_;
  auVar30._8_4_ = 0;
  auVar30._0_8_ = uVar7;
  auVar30._12_3_ = auVar22._12_3_;
  auVar38._8_2_ = 0;
  auVar38._0_8_ = uVar7;
  auVar38[10] = (char)(uVar7 >> 0x28);
  auVar38._11_4_ = auVar30._11_4_;
  auVar46._8_2_ = 0;
  auVar46._0_8_ = uVar7;
  auVar46._10_5_ = auVar38._10_5_;
  auVar54[8] = (char)(uVar7 >> 0x20);
  auVar54._0_8_ = uVar7;
  auVar54._9_6_ = auVar46._9_6_;
  auVar83._7_8_ = 0;
  auVar83._0_7_ = auVar54._8_7_;
  Var68 = CONCAT81(SUB158(auVar83 << 0x40,7),(char)(uVar7 >> 0x18));
  auVar99._9_6_ = 0;
  auVar99._0_9_ = Var68;
  auVar84._1_10_ = SUB1510(auVar99 << 0x30,5);
  auVar84[0] = (char)(uVar7 >> 0x10);
  auVar100._11_4_ = 0;
  auVar100._0_11_ = auVar84;
  auVar61[2] = (char)(uVar7 >> 8);
  auVar61._0_2_ = (ushort)uVar7;
  auVar61._3_12_ = SUB1512(auVar100 << 0x20,3);
  sVar111 = (ushort)(byte)uVar3 - ((ushort)uVar7 & 0xff);
  sVar115 = auVar73._0_2_ - auVar61._2_2_;
  sVar116 = auVar50._8_2_ - auVar54._8_2_;
  sVar117 = auVar34._10_2_ - auVar38._10_2_;
  auVar15._8_6_ = 0;
  auVar15._0_8_ = uVar8;
  auVar15[0xe] = (char)(uVar8 >> 0x38);
  auVar23._8_4_ = 0;
  auVar23._0_8_ = uVar8;
  auVar23[0xc] = (char)(uVar8 >> 0x30);
  auVar23._13_2_ = auVar15._13_2_;
  auVar31._8_4_ = 0;
  auVar31._0_8_ = uVar8;
  auVar31._12_3_ = auVar23._12_3_;
  auVar39._8_2_ = 0;
  auVar39._0_8_ = uVar8;
  auVar39[10] = (char)(uVar8 >> 0x28);
  auVar39._11_4_ = auVar31._11_4_;
  auVar47._8_2_ = 0;
  auVar47._0_8_ = uVar8;
  auVar47._10_5_ = auVar39._10_5_;
  auVar55[8] = (char)(uVar8 >> 0x20);
  auVar55._0_8_ = uVar8;
  auVar55._9_6_ = auVar47._9_6_;
  auVar85._7_8_ = 0;
  auVar85._0_7_ = auVar55._8_7_;
  Var81 = CONCAT81(SUB158(auVar85 << 0x40,7),(char)(uVar8 >> 0x18));
  auVar101._9_6_ = 0;
  auVar101._0_9_ = Var81;
  auVar86._1_10_ = SUB1510(auVar101 << 0x30,5);
  auVar86[0] = (char)(uVar8 >> 0x10);
  auVar102._11_4_ = 0;
  auVar102._0_11_ = auVar86;
  auVar62[2] = (char)(uVar8 >> 8);
  auVar62._0_2_ = (ushort)uVar8;
  auVar62._3_12_ = SUB1512(auVar102 << 0x20,3);
  sVar118 = ((ushort)uVar4 & 0xff) - ((ushort)uVar8 & 0xff);
  sVar122 = auVar58._2_2_ - auVar62._2_2_;
  sVar123 = auVar51._8_2_ - auVar55._8_2_;
  sVar124 = auVar35._10_2_ - auVar39._10_2_;
  auVar125._2_2_ = auVar72._0_2_ - auVar84._0_2_;
  auVar125._0_2_ = auVar65._0_2_ - auVar79._0_2_;
  auVar125._4_2_ = (short)Var64 - (short)Var78;
  auVar125._6_2_ = (short)Var71 - (short)Var68;
  auVar125._8_2_ = auVar105._4_2_;
  auVar125._10_2_ = auVar76._0_2_ - auVar86._0_2_;
  auVar125._12_2_ = auVar105._6_2_;
  auVar125._14_2_ = (short)Var75 - (short)Var81;
  auVar104 = pshuflw(auVar105,auVar125,0xd8);
  auVar104 = pshufhw(auVar104,auVar104,0x27);
  auVar134._0_4_ = auVar104._0_4_;
  auVar134._8_4_ = auVar104._8_4_;
  auVar134._4_4_ = auVar104._12_4_;
  auVar134._12_4_ = auVar104._4_4_;
  auVar104 = pshuflw(auVar134,auVar134,0xe1);
  auVar104 = pshufhw(auVar104,auVar104,0x4b);
  auVar133._0_2_ = sVar107 + auVar104._0_2_;
  auVar133._2_2_ = sVar108 + auVar104._2_2_;
  auVar133._4_2_ = auVar105._0_2_ + auVar104._4_2_;
  auVar133._6_2_ = auVar105._2_2_ + auVar104._6_2_;
  auVar133._8_2_ = sVar111 + auVar104._8_2_;
  auVar133._10_2_ = sVar115 + auVar104._10_2_;
  auVar133._12_2_ = sVar118 + auVar104._12_2_;
  auVar133._14_2_ = sVar122 + auVar104._14_2_;
  auVar143._0_2_ = sVar107 - auVar104._0_2_;
  auVar143._2_2_ = sVar108 - auVar104._2_2_;
  auVar143._4_2_ = auVar105._0_2_ - auVar104._4_2_;
  auVar143._6_2_ = auVar105._2_2_ - auVar104._6_2_;
  auVar143._8_2_ = sVar111 - auVar104._8_2_;
  auVar143._10_2_ = sVar115 - auVar104._10_2_;
  auVar143._12_2_ = sVar118 - auVar104._12_2_;
  auVar143._14_2_ = sVar122 - auVar104._14_2_;
  auVar104 = pmaddwd(auVar133,_DAT_001b6770);
  auVar134 = pmaddwd(auVar133,_DAT_001b6780);
  auVar120 = packssdw(auVar104,auVar134);
  auVar134 = pmaddwd(auVar143,_DAT_001b6790);
  auVar104 = pmaddwd(auVar143,_DAT_001b67a0);
  auVar157._0_4_ = auVar134._0_4_ + (int)DAT_001b67b0 >> 9;
  auVar157._4_4_ = auVar134._4_4_ + DAT_001b67b0._4_4_ >> 9;
  auVar157._8_4_ = auVar134._8_4_ + DAT_001b67b0._8_4_ >> 9;
  auVar157._12_4_ = auVar134._12_4_ + DAT_001b67b0._12_4_ >> 9;
  auVar144._0_4_ = auVar104._0_4_ + 0x3a9 >> 9;
  auVar144._4_4_ = auVar104._4_4_ + 0x3a9 >> 9;
  auVar144._8_4_ = auVar104._8_4_ + 0x3a9 >> 9;
  auVar144._12_4_ = auVar104._12_4_ + 0x3a9 >> 9;
  auVar158 = packssdw(auVar157,auVar144);
  sVar161 = auVar158._6_2_;
  sVar150 = auVar120._6_2_;
  auVar148._0_12_ = auVar120._0_12_;
  auVar148._12_2_ = sVar150;
  auVar148._14_2_ = sVar161;
  auVar147._12_4_ = auVar148._12_4_;
  auVar147._0_10_ = auVar120._0_10_;
  auVar147._10_2_ = auVar158._4_2_;
  auVar146._10_6_ = auVar147._10_6_;
  auVar146._0_8_ = auVar120._0_8_;
  auVar146._8_2_ = auVar120._4_2_;
  auVar145._8_8_ = auVar146._8_8_;
  auVar145._6_2_ = auVar158._2_2_;
  auVar145._4_2_ = auVar120._2_2_;
  auVar145._0_2_ = auVar120._0_2_;
  sVar156 = auVar158._0_2_;
  auVar145._2_2_ = sVar156;
  sVar111 = auVar120._8_2_;
  sVar162 = auVar158._8_2_;
  auVar119._0_8_ = CONCAT26(auVar158._10_2_,CONCAT24(auVar120._10_2_,CONCAT22(sVar162,sVar111)));
  auVar119._8_2_ = auVar120._12_2_;
  auVar119._10_2_ = auVar158._12_2_;
  sVar115 = auVar120._14_2_;
  auVar121._12_2_ = sVar115;
  auVar121._0_12_ = auVar119;
  sVar163 = auVar158._14_2_;
  auVar121._14_2_ = sVar163;
  auVar136._2_2_ = auVar18._12_2_ - auVar22._12_2_;
  auVar136._0_2_ = auVar24._12_2_ - auVar20._12_2_;
  auVar136._4_2_ = (auVar16._13_2_ >> 8) - (auVar12._13_2_ >> 8);
  auVar136._6_2_ = (auVar10._13_2_ >> 8) - (auVar14._13_2_ >> 8);
  auVar136._8_2_ = auVar105._12_2_;
  auVar136._10_2_ = auVar19._12_2_ - auVar23._12_2_;
  auVar136._12_2_ = auVar105._14_2_;
  auVar136._14_2_ = (auVar11._13_2_ >> 8) - (auVar15._13_2_ >> 8);
  auVar104 = pshuflw(auVar136,auVar136,0xd8);
  auVar104 = pshufhw(auVar104,auVar104,0x27);
  auVar151._0_4_ = auVar104._0_4_;
  auVar151._8_4_ = auVar104._8_4_;
  auVar151._4_4_ = auVar104._12_4_;
  auVar151._12_4_ = auVar104._4_4_;
  auVar104 = pshuflw(auVar151,auVar151,0xe1);
  auVar104 = pshufhw(auVar104,auVar104,0x4b);
  auVar112._0_2_ = sVar109 + auVar104._0_2_;
  auVar112._2_2_ = sVar110 + auVar104._2_2_;
  auVar112._4_2_ = auVar105._8_2_ + auVar104._4_2_;
  auVar112._6_2_ = auVar105._10_2_ + auVar104._6_2_;
  auVar112._8_2_ = sVar116 + auVar104._8_2_;
  auVar112._10_2_ = sVar117 + auVar104._10_2_;
  auVar112._12_2_ = sVar123 + auVar104._12_2_;
  auVar112._14_2_ = sVar124 + auVar104._14_2_;
  auVar159._0_2_ = sVar109 - auVar104._0_2_;
  auVar159._2_2_ = sVar110 - auVar104._2_2_;
  auVar159._4_2_ = auVar105._8_2_ - auVar104._4_2_;
  auVar159._6_2_ = auVar105._10_2_ - auVar104._6_2_;
  auVar159._8_2_ = sVar116 - auVar104._8_2_;
  auVar159._10_2_ = sVar117 - auVar104._10_2_;
  auVar159._12_2_ = sVar123 - auVar104._12_2_;
  auVar159._14_2_ = sVar124 - auVar104._14_2_;
  auVar105 = pmaddwd(_DAT_001b6770,auVar112);
  auVar104 = pmaddwd(auVar112,_DAT_001b6780);
  auVar105 = packssdw(auVar105,auVar104);
  auVar104 = pmaddwd(_DAT_001b6790,auVar159);
  auVar134 = pmaddwd(auVar159,_DAT_001b67a0);
  auVar135._0_4_ = auVar104._0_4_ + (int)DAT_001b67b0 >> 9;
  auVar135._4_4_ = auVar104._4_4_ + DAT_001b67b0._4_4_ >> 9;
  auVar135._8_4_ = auVar104._8_4_ + DAT_001b67b0._8_4_ >> 9;
  auVar135._12_4_ = auVar104._12_4_ + DAT_001b67b0._12_4_ >> 9;
  auVar160._0_4_ = auVar134._0_4_ + 0x3a9 >> 9;
  auVar160._4_4_ = auVar134._4_4_ + 0x3a9 >> 9;
  auVar160._8_4_ = auVar134._8_4_ + 0x3a9 >> 9;
  auVar160._12_4_ = auVar134._12_4_ + 0x3a9 >> 9;
  auVar136 = packssdw(auVar135,auVar160);
  sVar118 = auVar136._6_2_;
  sVar116 = auVar105._6_2_;
  auVar129._0_12_ = auVar105._0_12_;
  auVar129._12_2_ = sVar116;
  auVar129._14_2_ = sVar118;
  auVar128._12_4_ = auVar129._12_4_;
  auVar128._0_10_ = auVar105._0_10_;
  auVar128._10_2_ = auVar136._4_2_;
  auVar127._10_6_ = auVar128._10_6_;
  auVar127._0_8_ = auVar105._0_8_;
  auVar127._8_2_ = auVar105._4_2_;
  auVar126._8_8_ = auVar127._8_8_;
  auVar126._6_2_ = auVar136._2_2_;
  auVar126._4_2_ = auVar105._2_2_;
  auVar126._0_2_ = auVar105._0_2_;
  sVar117 = auVar136._0_2_;
  auVar126._2_2_ = sVar117;
  sVar107 = auVar105._8_2_;
  sVar122 = auVar136._8_2_;
  auVar103._0_8_ = CONCAT26(auVar136._10_2_,CONCAT24(auVar105._10_2_,CONCAT22(sVar122,sVar107)));
  auVar103._8_2_ = auVar105._12_2_;
  auVar103._10_2_ = auVar136._12_2_;
  sVar108 = auVar105._14_2_;
  auVar104._12_2_ = sVar108;
  auVar104._0_12_ = auVar103;
  sVar123 = auVar136._14_2_;
  auVar104._14_2_ = sVar123;
  auVar149._8_8_ = auVar119._0_8_;
  auVar149._0_8_ = auVar145._0_8_;
  auVar134 = pshuflw(auVar121,auVar149,0x72);
  auVar151 = pshufhw(_DAT_001b67b0,auVar134,0x72);
  auVar155._4_4_ = auVar146._8_4_;
  auVar155._0_4_ = auVar147._12_4_;
  auVar155._8_4_ = auVar121._12_4_;
  auVar155._12_4_ = auVar119._8_4_;
  auVar134 = pshuflw(auVar155,auVar155,0x72);
  auVar134 = pshufhw(auVar134,auVar134,0x72);
  auVar152._0_2_ = auVar151._0_2_ - auVar134._0_2_;
  auVar152._2_2_ = auVar151._2_2_ - auVar134._2_2_;
  auVar152._4_2_ = auVar151._4_2_ - auVar134._4_2_;
  auVar152._6_2_ = auVar151._6_2_ - auVar134._6_2_;
  auVar152._8_2_ = auVar151._8_2_ - auVar134._8_2_;
  auVar152._10_2_ = auVar151._10_2_ - auVar134._10_2_;
  auVar152._12_2_ = auVar151._12_2_ - auVar134._12_2_;
  auVar152._14_2_ = auVar151._14_2_ - auVar134._14_2_;
  auVar151 = pmaddwd(auVar152,_DAT_001b67d0);
  auVar134 = pmaddwd(auVar152,_DAT_001b67e0);
  auVar154._0_4_ = auVar151._0_4_ + 0x12ee0 >> 0x10;
  auVar154._4_4_ = auVar151._4_4_ + 0x12ee0 >> 0x10;
  auVar154._8_4_ = auVar151._8_4_ + 0x12ee0 >> 0x10;
  auVar154._12_4_ = auVar151._12_4_ + 0x12ee0 >> 0x10;
  auVar153._0_4_ = auVar134._0_4_ + 51000 >> 0x10;
  auVar153._4_4_ = auVar134._4_4_ + 51000 >> 0x10;
  auVar153._8_4_ = auVar134._8_4_ + 51000 >> 0x10;
  auVar153._12_4_ = auVar134._12_4_ + 51000 >> 0x10;
  auVar155 = packssdw(auVar154,auVar154);
  auVar151 = packssdw(auVar153,auVar153);
  sVar139 = auVar120._2_2_ + auVar120._4_2_;
  sVar140 = auVar158._2_2_ + auVar158._4_2_;
  sVar141 = auVar120._10_2_ + auVar120._12_2_;
  sVar142 = auVar158._10_2_ + auVar158._12_2_;
  sVar109 = auVar145._0_2_ + sVar150 + 7;
  sVar110 = sVar156 + sVar161 + 7;
  sVar124 = sVar111 + sVar115 + 7;
  sVar138 = sVar162 + sVar163 + 7;
  auVar164._0_2_ = sVar109 + sVar139;
  auVar164._2_2_ = sVar110 + sVar140;
  auVar164._4_2_ = sVar124 + sVar141;
  auVar164._6_2_ = sVar138 + sVar142;
  auVar164._8_2_ = sVar139 + 7 + sVar139;
  auVar164._10_2_ = sVar140 + 7 + sVar140;
  auVar164._12_2_ = sVar141 + 7 + sVar141;
  auVar164._14_2_ = sVar142 + 7 + sVar142;
  auVar137._0_2_ = sVar109 - sVar139;
  auVar137._2_2_ = sVar110 - sVar140;
  auVar137._4_2_ = sVar124 - sVar141;
  auVar137._6_2_ = sVar138 - sVar142;
  auVar137._8_2_ = (sVar139 + 7) - sVar139;
  auVar137._10_2_ = (sVar140 + 7) - sVar140;
  auVar137._12_2_ = (sVar141 + 7) - sVar141;
  auVar137._14_2_ = (sVar142 + 7) - sVar142;
  auVar120 = psraw(auVar164,4);
  auVar134 = psraw(auVar137,4);
  *(long *)out = auVar120._0_8_;
  *(ulong *)(out + 4) =
       CONCAT26(auVar155._6_2_ - (ushort)(sVar162 == sVar163),
                CONCAT24(auVar155._4_2_ - (ushort)(sVar111 == sVar115),
                         CONCAT22(auVar155._2_2_ - (ushort)(sVar156 == sVar161),
                                  auVar155._0_2_ - (ushort)(auVar145._0_2_ == sVar150))));
  *(long *)(out + 8) = auVar134._0_8_;
  *(long *)(out + 0xc) = auVar151._0_8_;
  auVar130._8_8_ = auVar103._0_8_;
  auVar130._0_8_ = auVar126._0_8_;
  auVar134 = pshuflw(auVar104,auVar130,0x72);
  auVar134 = pshufhw(auVar134,auVar134,0x72);
  auVar131._4_4_ = auVar127._8_4_;
  auVar131._0_4_ = auVar128._12_4_;
  auVar131._8_4_ = auVar104._12_4_;
  auVar131._12_4_ = auVar103._8_4_;
  auVar104 = pshuflw(auVar131,auVar131,0x72);
  auVar104 = pshufhw(auVar104,auVar104,0x72);
  auVar120._0_2_ = auVar134._0_2_ - auVar104._0_2_;
  auVar120._2_2_ = auVar134._2_2_ - auVar104._2_2_;
  auVar120._4_2_ = auVar134._4_2_ - auVar104._4_2_;
  auVar120._6_2_ = auVar134._6_2_ - auVar104._6_2_;
  auVar120._8_2_ = auVar134._8_2_ - auVar104._8_2_;
  auVar120._10_2_ = auVar134._10_2_ - auVar104._10_2_;
  auVar120._12_2_ = auVar134._12_2_ - auVar104._12_2_;
  auVar120._14_2_ = auVar134._14_2_ - auVar104._14_2_;
  auVar104 = pmaddwd(auVar106,auVar120);
  auVar106 = pmaddwd(auVar120,auVar114);
  auVar158._0_4_ = auVar104._0_4_ + 0x12ee0 >> 0x10;
  auVar158._4_4_ = auVar104._4_4_ + 0x12ee0 >> 0x10;
  auVar158._8_4_ = auVar104._8_4_ + 0x12ee0 >> 0x10;
  auVar158._12_4_ = auVar104._12_4_ + 0x12ee0 >> 0x10;
  auVar114._0_4_ = auVar106._0_4_ + 51000 >> 0x10;
  auVar114._4_4_ = auVar106._4_4_ + 51000 >> 0x10;
  auVar114._8_4_ = auVar106._8_4_ + 51000 >> 0x10;
  auVar114._12_4_ = auVar106._12_4_ + 51000 >> 0x10;
  auVar104 = packssdw(auVar158,auVar158);
  auVar106 = packssdw(auVar114,auVar114);
  sVar124 = auVar105._2_2_ + auVar105._4_2_;
  sVar138 = auVar136._2_2_ + auVar136._4_2_;
  sVar139 = auVar105._10_2_ + auVar105._12_2_;
  sVar140 = auVar136._10_2_ + auVar136._12_2_;
  sVar109 = auVar126._0_2_ + sVar116 + 7;
  sVar110 = sVar117 + sVar118 + 7;
  sVar111 = sVar107 + sVar108 + 7;
  sVar115 = sVar122 + sVar123 + 7;
  auVar132._0_2_ = sVar109 + sVar124;
  auVar132._2_2_ = sVar110 + sVar138;
  auVar132._4_2_ = sVar111 + sVar139;
  auVar132._6_2_ = sVar115 + sVar140;
  auVar132._8_2_ = sVar124 + 7 + sVar124;
  auVar132._10_2_ = sVar138 + 7 + sVar138;
  auVar132._12_2_ = sVar139 + 7 + sVar139;
  auVar132._14_2_ = sVar140 + 7 + sVar140;
  auVar113._0_2_ = sVar109 - sVar124;
  auVar113._2_2_ = sVar110 - sVar138;
  auVar113._4_2_ = sVar111 - sVar139;
  auVar113._6_2_ = sVar115 - sVar140;
  auVar113._8_2_ = (sVar124 + 7) - sVar124;
  auVar113._10_2_ = (sVar138 + 7) - sVar138;
  auVar113._12_2_ = (sVar139 + 7) - sVar139;
  auVar113._14_2_ = (sVar140 + 7) - sVar140;
  auVar105 = psraw(auVar132,4);
  auVar114 = psraw(auVar113,4);
  *(long *)(out + 0x10) = auVar105._0_8_;
  *(ulong *)(out + 0x14) =
       CONCAT26(auVar104._6_2_ - (ushort)(sVar122 == sVar123),
                CONCAT24(auVar104._4_2_ - (ushort)(sVar107 == sVar108),
                         CONCAT22(auVar104._2_2_ - (ushort)(sVar117 == sVar118),
                                  auVar104._0_2_ - (ushort)(auVar126._0_2_ == sVar116))));
  *(long *)(out + 0x18) = auVar114._0_8_;
  *(long *)(out + 0x1c) = auVar106._0_8_;
  return;
}

Assistant:

static void FTransform2_SSE2(const uint8_t* WEBP_RESTRICT src,
                             const uint8_t* WEBP_RESTRICT ref,
                             int16_t* WEBP_RESTRICT out) {
  const __m128i zero = _mm_setzero_si128();

  // Load src and convert to 16b.
  const __m128i src0 = _mm_loadl_epi64((const __m128i*)&src[0 * BPS]);
  const __m128i src1 = _mm_loadl_epi64((const __m128i*)&src[1 * BPS]);
  const __m128i src2 = _mm_loadl_epi64((const __m128i*)&src[2 * BPS]);
  const __m128i src3 = _mm_loadl_epi64((const __m128i*)&src[3 * BPS]);
  const __m128i src_0 = _mm_unpacklo_epi8(src0, zero);
  const __m128i src_1 = _mm_unpacklo_epi8(src1, zero);
  const __m128i src_2 = _mm_unpacklo_epi8(src2, zero);
  const __m128i src_3 = _mm_unpacklo_epi8(src3, zero);
  // Load ref and convert to 16b.
  const __m128i ref0 = _mm_loadl_epi64((const __m128i*)&ref[0 * BPS]);
  const __m128i ref1 = _mm_loadl_epi64((const __m128i*)&ref[1 * BPS]);
  const __m128i ref2 = _mm_loadl_epi64((const __m128i*)&ref[2 * BPS]);
  const __m128i ref3 = _mm_loadl_epi64((const __m128i*)&ref[3 * BPS]);
  const __m128i ref_0 = _mm_unpacklo_epi8(ref0, zero);
  const __m128i ref_1 = _mm_unpacklo_epi8(ref1, zero);
  const __m128i ref_2 = _mm_unpacklo_epi8(ref2, zero);
  const __m128i ref_3 = _mm_unpacklo_epi8(ref3, zero);
  // Compute difference. -> 00 01 02 03  00' 01' 02' 03'
  const __m128i diff0 = _mm_sub_epi16(src_0, ref_0);
  const __m128i diff1 = _mm_sub_epi16(src_1, ref_1);
  const __m128i diff2 = _mm_sub_epi16(src_2, ref_2);
  const __m128i diff3 = _mm_sub_epi16(src_3, ref_3);

  // Unpack and shuffle
  // 00 01 02 03   0 0 0 0
  // 10 11 12 13   0 0 0 0
  // 20 21 22 23   0 0 0 0
  // 30 31 32 33   0 0 0 0
  const __m128i shuf01l = _mm_unpacklo_epi32(diff0, diff1);
  const __m128i shuf23l = _mm_unpacklo_epi32(diff2, diff3);
  const __m128i shuf01h = _mm_unpackhi_epi32(diff0, diff1);
  const __m128i shuf23h = _mm_unpackhi_epi32(diff2, diff3);
  __m128i v01l, v32l;
  __m128i v01h, v32h;

  // First pass
  FTransformPass1_SSE2(&shuf01l, &shuf23l, &v01l, &v32l);
  FTransformPass1_SSE2(&shuf01h, &shuf23h, &v01h, &v32h);

  // Second pass
  FTransformPass2_SSE2(&v01l, &v32l, out + 0);
  FTransformPass2_SSE2(&v01h, &v32h, out + 16);
}